

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
* InferTaprootTree(optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                   *__return_storage_ptr__,TaprootSpendData *spenddata,XOnlyPubKey *output)

{
  uint256 *puVar1;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *pmVar2;
  pointer ppTVar3;
  uint uVar4;
  TreeNode *pTVar5;
  default_delete<TreeNode> *pdVar6;
  bool bVar7;
  uchar *puVar8;
  _Base_ptr p_Var9;
  TreeNode *pTVar10;
  undefined8 *puVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  TreeNode *pTVar14;
  ulong uVar15;
  uint256 *merkle_root_00;
  long lVar16;
  long *plVar17;
  TreeNode *__ptr;
  char *pcVar18;
  long *plVar19;
  ulong uVar20;
  bool bVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Span<const_unsigned_char> control;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> b;
  Span<const_unsigned_char> script;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ret;
  uint256 merkle_root;
  uint256 leaf_hash;
  optional<std::pair<XOnlyPubKey,_bool>_> tweak;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [9];
  uchar uStack_df;
  uchar uStack_de;
  uchar uStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  uchar uStack_d9;
  undefined8 local_d8;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  uchar uStack_c9;
  undefined1 local_c8 [40];
  _Head_base<0UL,_TreeNode_*,_false> _Stack_a0;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *local_98;
  uchar auStack_90 [8];
  unique_ptr<TreeNode,_std::default_delete<TreeNode>_> local_88;
  undefined7 uStack_7f;
  unkbyte9 local_78;
  bool local_6e;
  _Storage<std::pair<XOnlyPubKey,_bool>,_true> local_5a;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = &spenddata->merkle_root;
  pmVar2 = &spenddata->scripts;
  puVar8 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (puVar1,pmVar2);
  merkle_root_00 = (uint256 *)0x0;
  if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
       *)puVar8 != pmVar2) {
    merkle_root_00 = puVar1;
  }
  XOnlyPubKey::CreateTapTweak
            ((optional<std::pair<XOnlyPubKey,_bool>_> *)&local_5a._M_value,&spenddata->internal_key,
             merkle_root_00);
  if ((local_39 == '\x01') &&
     (auVar29[0] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0] ==
                    local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0]),
     auVar29[1] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[1] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[1]),
     auVar29[2] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[2] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[2]),
     auVar29[3] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[3] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[3]),
     auVar29[4] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[4] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[4]),
     auVar29[5] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[5] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[5]),
     auVar29[6] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[6] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[6]),
     auVar29[7] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[7] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[7]),
     auVar29[8] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[8] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[8]),
     auVar29[9] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[9] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[9]),
     auVar29[10] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[10] ==
                    local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[10]),
     auVar29[0xb] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xb] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb]),
     auVar29[0xc] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xc] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc]),
     auVar29[0xd] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xd] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd]),
     auVar29[0xe] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xe] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe]),
     auVar29[0xf] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xf] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf]),
     auVar22[0] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x10] ==
                   local_5a._16_1_),
     auVar22[1] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x11] ==
                   local_5a._17_1_),
     auVar22[2] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x12] ==
                   local_5a._18_1_),
     auVar22[3] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x13] ==
                   local_5a._19_1_),
     auVar22[4] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x14] ==
                   local_5a._20_1_),
     auVar22[5] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x15] ==
                   local_5a._21_1_),
     auVar22[6] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x16] ==
                   local_5a._22_1_),
     auVar22[7] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x17] ==
                   local_5a._23_1_),
     auVar22[8] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x18] ==
                   local_5a._24_1_),
     auVar22[9] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x19] ==
                   local_5a._25_1_),
     auVar22[10] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                    local_5a._26_1_),
     auVar22[0xb] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                     local_5a._27_1_),
     auVar22[0xc] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                     local_5a._28_1_),
     auVar22[0xd] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                     local_5a._29_1_),
     auVar22[0xe] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                     local_5a._30_1_),
     auVar22[0xf] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                     local_5a._31_1_), auVar22 = auVar22 & auVar29,
     (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff)) {
    local_128.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __ptr = (TreeNode *)pmVar2;
    puVar8 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (puVar1);
    if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
         *)puVar8 == pmVar2) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl = local_128.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 8) =
           local_128.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 0x10) =
           local_128.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_128.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
      ._M_engaged = true;
    }
    else {
      local_6e = false;
      _local_88 = SUB169((undefined1  [16])0x0,0);
      uStack_7f = 0;
      local_78 = SUB169((undefined1  [16])0x0,7);
      local_c8._32_8_ = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      _Stack_a0._M_head_impl =
           *(TreeNode **)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 8);
      local_98 = *(pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> **)
                  ((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10);
      auStack_90 = *(uchar (*) [8])
                    ((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18);
      for (p_Var13 = (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &(spenddata->scripts)._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13)) {
        p_Var9 = p_Var13[2]._M_right;
        if (p_Var9 != (_Base_ptr)&p_Var13[2]._M_parent) {
          do {
            uVar4 = *(uint *)&p_Var13[1]._M_right;
            if ((uVar4 & 0xffffff01) == 0) {
              lVar16 = (long)p_Var9[1]._M_parent - (long)*(byte **)(p_Var9 + 1);
              __ptr = (TreeNode *)(lVar16 - 0x1022);
              if ((((TreeNode *)0xffffffffffffeffe < __ptr) && (((int)lVar16 - 1U & 0x1f) == 0)) &&
                 (uVar4 == (**(byte **)(p_Var9 + 1) & 0xfffffffe))) {
                script.m_size = (long)p_Var13[1]._M_parent - (long)*(uchar **)(p_Var13 + 1);
                script.m_data = *(uchar **)(p_Var13 + 1);
                ComputeTapleafHash((uint256 *)local_c8,(uint8_t)uVar4,script);
                __ptr = *(TreeNode **)(p_Var9 + 1);
                control.m_size = (long)p_Var9[1]._M_parent - (long)__ptr;
                control.m_data = (uchar *)__ptr;
                ComputeTaprootMerkleRoot((uint256 *)local_e8,control,(uint256 *)local_c8);
                auVar30[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_e8[0]);
                auVar30[1] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[1] ==
                              local_e8[1]);
                auVar30[2] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[2] ==
                              local_e8[2]);
                auVar30[3] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[3] ==
                              local_e8[3]);
                auVar30[4] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[4] ==
                              local_e8[4]);
                auVar30[5] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[5] ==
                              local_e8[5]);
                auVar30[6] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[6] ==
                              local_e8[6]);
                auVar30[7] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[7] ==
                              local_e8[7]);
                auVar30[8] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[8] ==
                              local_e8[8]);
                auVar30[9] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[9] ==
                              uStack_df);
                auVar30[10] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[10]
                               == uStack_de);
                auVar30[0xb] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xb]
                                == uStack_dd);
                auVar30[0xc] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xc]
                                == uStack_dc);
                auVar30[0xd] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xd]
                                == uStack_db);
                auVar30[0xe] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xe]
                                == uStack_da);
                auVar30[0xf] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xf]
                                == uStack_d9);
                auVar23[0] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x10]
                              == (uchar)local_d8);
                auVar23[1] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x11]
                              == local_d8._1_1_);
                auVar23[2] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x12]
                              == local_d8._2_1_);
                auVar23[3] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x13]
                              == local_d8._3_1_);
                auVar23[4] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x14]
                              == local_d8._4_1_);
                auVar23[5] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x15]
                              == local_d8._5_1_);
                auVar23[6] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x16]
                              == local_d8._6_1_);
                auVar23[7] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x17]
                              == local_d8._7_1_);
                auVar23[8] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x18]
                              == uStack_d0);
                auVar23[9] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x19]
                              == uStack_cf);
                auVar23[10] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x1a]
                               == uStack_ce);
                auVar23[0xb] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1b] == uStack_cd);
                auVar23[0xc] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1c] == uStack_cc);
                auVar23[0xd] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1d] == uStack_cb);
                auVar23[0xe] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1e] == uStack_ca);
                auVar23[0xf] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1f] == uStack_c9);
                auVar23 = auVar23 & auVar30;
                if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
                  uVar15 = (long)p_Var9[1]._M_parent + (-0x21 - *(long *)(p_Var9 + 1));
                  plVar19 = (long *)((long)local_c8 + 0x20);
                  if (0x1f < uVar15) {
                    uVar15 = uVar15 >> 5;
                    uVar12 = 0;
                    do {
                      if (((char)plVar19[7] == '\x01') && (*(char *)((long)plVar19 + 0x39) == '\0'))
                      goto LAB_003d895e;
                      lVar16 = (~uVar12 + uVar15) * 0x20;
                      puVar11 = (undefined8 *)(*(long *)(p_Var9 + 1) + 0x21 + lVar16);
                      local_108 = *puVar11;
                      uStack_100 = puVar11[1];
                      puVar11 = (undefined8 *)(*(long *)(p_Var9 + 1) + 0x31 + lVar16);
                      local_f8 = *puVar11;
                      uStack_f0 = puVar11[1];
                      plVar17 = plVar19 + 4;
                      if (plVar19[4] == 0) {
                        *(undefined2 *)(plVar19 + 7) = 0x101;
                        puVar11 = (undefined8 *)operator_new(0x40);
                        puVar11[6] = 0;
                        puVar11[7] = 0;
                        puVar11[4] = 0;
                        puVar11[5] = 0;
                        puVar11[2] = 0;
                        puVar11[3] = 0;
                        *puVar11 = 0;
                        puVar11[1] = 0;
                        pdVar6 = (default_delete<TreeNode> *)*plVar17;
                        *plVar17 = (long)puVar11;
                        if (pdVar6 != (default_delete<TreeNode> *)0x0) {
                          std::default_delete<TreeNode>::operator()(pdVar6,__ptr);
                        }
                        puVar11 = (undefined8 *)operator_new(0x40);
                        puVar11[6] = 0;
                        puVar11[7] = 0;
                        puVar11[4] = 0;
                        puVar11[5] = 0;
                        puVar11[2] = 0;
                        puVar11[3] = 0;
                        *puVar11 = 0;
                        puVar11[1] = 0;
                        pdVar6 = (default_delete<TreeNode> *)plVar19[5];
                        plVar19[5] = (long)puVar11;
                        if (pdVar6 != (default_delete<TreeNode> *)0x0) {
                          std::default_delete<TreeNode>::operator()(pdVar6,__ptr);
                          puVar11 = (undefined8 *)plVar19[5];
                        }
                        puVar11[2] = local_f8;
                        puVar11[3] = uStack_f0;
                        *puVar11 = local_108;
                        puVar11[1] = uStack_100;
                      }
                      else {
                        uVar20 = 0;
                        bVar21 = true;
                        while( true ) {
                          pcVar18 = (char *)plVar17[uVar20];
                          auVar27[0] = -(pcVar18[0x10] == (char)local_f8);
                          auVar27[1] = -(pcVar18[0x11] == local_f8._1_1_);
                          auVar27[2] = -(pcVar18[0x12] == local_f8._2_1_);
                          auVar27[3] = -(pcVar18[0x13] == local_f8._3_1_);
                          auVar27[4] = -(pcVar18[0x14] == local_f8._4_1_);
                          auVar27[5] = -(pcVar18[0x15] == local_f8._5_1_);
                          auVar27[6] = -(pcVar18[0x16] == local_f8._6_1_);
                          auVar27[7] = -(pcVar18[0x17] == local_f8._7_1_);
                          auVar27[8] = -(pcVar18[0x18] == (char)uStack_f0);
                          auVar27[9] = -(pcVar18[0x19] == uStack_f0._1_1_);
                          auVar27[10] = -(pcVar18[0x1a] == uStack_f0._2_1_);
                          auVar27[0xb] = -(pcVar18[0x1b] == uStack_f0._3_1_);
                          auVar27[0xc] = -(pcVar18[0x1c] == uStack_f0._4_1_);
                          auVar27[0xd] = -(pcVar18[0x1d] == uStack_f0._5_1_);
                          auVar27[0xe] = -(pcVar18[0x1e] == uStack_f0._6_1_);
                          auVar27[0xf] = -(pcVar18[0x1f] == uStack_f0._7_1_);
                          auVar24[0] = -(*pcVar18 == (char)local_108);
                          auVar24[1] = -(pcVar18[1] == local_108._1_1_);
                          auVar24[2] = -(pcVar18[2] == local_108._2_1_);
                          auVar24[3] = -(pcVar18[3] == local_108._3_1_);
                          auVar24[4] = -(pcVar18[4] == local_108._4_1_);
                          auVar24[5] = -(pcVar18[5] == local_108._5_1_);
                          auVar24[6] = -(pcVar18[6] == local_108._6_1_);
                          auVar24[7] = -(pcVar18[7] == local_108._7_1_);
                          auVar24[8] = -(pcVar18[8] == (char)uStack_100);
                          auVar24[9] = -(pcVar18[9] == uStack_100._1_1_);
                          auVar24[10] = -(pcVar18[10] == uStack_100._2_1_);
                          auVar24[0xb] = -(pcVar18[0xb] == uStack_100._3_1_);
                          auVar24[0xc] = -(pcVar18[0xc] == uStack_100._4_1_);
                          auVar24[0xd] = -(pcVar18[0xd] == uStack_100._5_1_);
                          auVar24[0xe] = -(pcVar18[0xe] == uStack_100._6_1_);
                          auVar24[0xf] = -(pcVar18[0xf] == uStack_100._7_1_);
                          auVar24 = auVar24 & auVar27;
                          if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) break;
                          __ptr = (TreeNode *)(pcVar18 + 0x20);
                          pTVar10 = (TreeNode *)
                                    std::
                                    __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                              ();
                          if (pTVar10 == (TreeNode *)(pcVar18 + 0x20)) {
                            pcVar18 = (char *)plVar17[uVar20 ^ 1];
                            auVar28[0] = -(pcVar18[0x10] == (char)local_f8);
                            auVar28[1] = -(pcVar18[0x11] == local_f8._1_1_);
                            auVar28[2] = -(pcVar18[0x12] == local_f8._2_1_);
                            auVar28[3] = -(pcVar18[0x13] == local_f8._3_1_);
                            auVar28[4] = -(pcVar18[0x14] == local_f8._4_1_);
                            auVar28[5] = -(pcVar18[0x15] == local_f8._5_1_);
                            auVar28[6] = -(pcVar18[0x16] == local_f8._6_1_);
                            auVar28[7] = -(pcVar18[0x17] == local_f8._7_1_);
                            auVar28[8] = -(pcVar18[0x18] == (char)uStack_f0);
                            auVar28[9] = -(pcVar18[0x19] == uStack_f0._1_1_);
                            auVar28[10] = -(pcVar18[0x1a] == uStack_f0._2_1_);
                            auVar28[0xb] = -(pcVar18[0x1b] == uStack_f0._3_1_);
                            auVar28[0xc] = -(pcVar18[0x1c] == uStack_f0._4_1_);
                            auVar28[0xd] = -(pcVar18[0x1d] == uStack_f0._5_1_);
                            auVar28[0xe] = -(pcVar18[0x1e] == uStack_f0._6_1_);
                            auVar28[0xf] = -(pcVar18[0x1f] == uStack_f0._7_1_);
                            auVar25[0] = -(*pcVar18 == (char)local_108);
                            auVar25[1] = -(pcVar18[1] == local_108._1_1_);
                            auVar25[2] = -(pcVar18[2] == local_108._2_1_);
                            auVar25[3] = -(pcVar18[3] == local_108._3_1_);
                            auVar25[4] = -(pcVar18[4] == local_108._4_1_);
                            auVar25[5] = -(pcVar18[5] == local_108._5_1_);
                            auVar25[6] = -(pcVar18[6] == local_108._6_1_);
                            auVar25[7] = -(pcVar18[7] == local_108._7_1_);
                            auVar25[8] = -(pcVar18[8] == (char)uStack_100);
                            auVar25[9] = -(pcVar18[9] == uStack_100._1_1_);
                            auVar25[10] = -(pcVar18[10] == uStack_100._2_1_);
                            auVar25[0xb] = -(pcVar18[0xb] == uStack_100._3_1_);
                            auVar25[0xc] = -(pcVar18[0xc] == uStack_100._4_1_);
                            auVar25[0xd] = -(pcVar18[0xd] == uStack_100._5_1_);
                            auVar25[0xe] = -(pcVar18[0xe] == uStack_100._6_1_);
                            auVar25[0xf] = -(pcVar18[0xf] == uStack_100._7_1_);
                            auVar25 = auVar25 & auVar28;
                            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                                        (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) {
                              pcVar18 = (char *)plVar17[uVar20];
                              break;
                            }
                          }
                          uVar20 = 1;
                          bVar7 = !bVar21;
                          bVar21 = false;
                          if (bVar7) goto LAB_003d895e;
                        }
                        *(undefined8 *)(pcVar18 + 0x10) = local_f8;
                        *(undefined8 *)(pcVar18 + 0x18) = uStack_f0;
                        *(undefined8 *)pcVar18 = local_108;
                        *(undefined8 *)(pcVar18 + 8) = uStack_100;
                        plVar17 = plVar17 + (uVar20 ^ 1);
                      }
                      plVar19 = (long *)*plVar17;
                      uVar12 = uVar12 + 1;
                    } while (uVar12 != uVar15 + (uVar15 == 0));
                  }
                  if (plVar19[4] != 0) {
LAB_003d895e:
                    (__return_storage_ptr__->
                    super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                    ._M_engaged = false;
                    goto LAB_003d8988;
                  }
                  *(undefined2 *)(plVar19 + 7) = 1;
                  plVar19[6] = (long)(p_Var13 + 1);
                  *plVar19 = local_c8._0_8_;
                  plVar19[1] = CONCAT17(local_c8[0xf],
                                        CONCAT16(local_c8[0xe],
                                                 CONCAT15(local_c8[0xd],
                                                          CONCAT14(local_c8[0xc],
                                                                   CONCAT13(local_c8[0xb],
                                                                            CONCAT12(local_c8[10],
                                                                                     CONCAT11(
                                                  local_c8[9],local_c8[8])))))));
                  plVar19[2] = CONCAT17(local_c8[0x17],
                                        CONCAT16(local_c8[0x16],
                                                 CONCAT15(local_c8[0x15],
                                                          CONCAT14(local_c8[0x14],
                                                                   CONCAT13(local_c8[0x13],
                                                                            CONCAT12(local_c8[0x12],
                                                                                     CONCAT11(
                                                  local_c8[0x11],local_c8[0x10])))))));
                  plVar19[3] = CONCAT17(local_c8[0x1f],
                                        CONCAT16(local_c8[0x1e],
                                                 CONCAT15(local_c8[0x1d],
                                                          CONCAT14(local_c8[0x1c],
                                                                   CONCAT13(local_c8[0x1b],
                                                                            CONCAT12(local_c8[0x1a],
                                                                                     CONCAT11(
                                                  local_c8[0x19],local_c8[0x18])))))));
                }
              }
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
          } while (p_Var9 != (_Base_ptr)&p_Var13[2]._M_parent);
        }
      }
      local_e8._0_8_ = operator_new(8);
      register0x00000008 = (pointer)(local_e8._0_8_ + 8);
      *(TreeNode **)local_e8._0_8_ = (TreeNode *)((long)local_c8 + 0x20);
      local_d8 = register0x00000008;
      do {
        pTVar10 = stack0xffffffffffffff20[-1];
        if (pTVar10->explored != true) {
          bVar21 = false;
          goto LAB_003d896c;
        }
        ppTVar3 = stack0xffffffffffffff20 + -1;
        if (pTVar10->inner == false) {
          local_c8._0_8_ = ((long)stack0xffffffffffffff20 - local_e8._0_8_ >> 3) + -1;
          __ptr = (TreeNode *)local_c8;
          std::
          vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
          ::
          emplace_back<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,int_const&>
                    ((vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
                      *)&local_128,(unsigned_long *)local_c8,&pTVar10->leaf->first,
                     &pTVar10->leaf->second);
LAB_003d888b:
          pTVar10->done = true;
          unique0x10003233 = ppTVar3;
        }
        else {
          pTVar14 = pTVar10->sub[0]._M_t.
                    super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                    super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                    super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
          if (((pTVar14->done == true) &&
              (pTVar5 = pTVar10->sub[1]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl, pTVar5->done == false
              )) && (pTVar5->explored == false)) {
            __ptr = (TreeNode *)pTVar5->sub;
            puVar8 = std::
                     __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                               ();
            if ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)puVar8 == pTVar5->sub) {
              pTVar14 = pTVar10->sub[0]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
              goto LAB_003d88a0;
            }
            __ptr = pTVar10->sub[1]._M_t.
                    super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                    super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                    super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
            a.m_size = 0x20;
            a.m_data = (uchar *)__ptr;
            b.m_size = 0x20;
            b.m_data = (uchar *)__ptr;
            ComputeTapbranchHash((uint256 *)local_c8,a,b);
            auVar31[0] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0] == local_c8[0]);
            auVar31[1] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[1] == local_c8[1]);
            auVar31[2] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[2] == local_c8[2]);
            auVar31[3] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[3] == local_c8[3]);
            auVar31[4] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[4] == local_c8[4]);
            auVar31[5] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[5] == local_c8[5]);
            auVar31[6] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[6] == local_c8[6]);
            auVar31[7] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[7] == local_c8[7]);
            auVar31[8] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[8] == local_c8[8]);
            auVar31[9] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[9] == local_c8[9]);
            auVar31[10] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[10] ==
                           local_c8[10]);
            auVar31[0xb] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                            local_c8[0xb]);
            auVar31[0xc] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                            local_c8[0xc]);
            auVar31[0xd] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                            local_c8[0xd]);
            auVar31[0xe] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                            local_c8[0xe]);
            auVar31[0xf] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                            local_c8[0xf]);
            auVar26[0] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x10] ==
                          local_c8[0x10]);
            auVar26[1] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x11] ==
                          local_c8[0x11]);
            auVar26[2] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x12] ==
                          local_c8[0x12]);
            auVar26[3] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x13] ==
                          local_c8[0x13]);
            auVar26[4] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x14] ==
                          local_c8[0x14]);
            auVar26[5] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x15] ==
                          local_c8[0x15]);
            auVar26[6] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x16] ==
                          local_c8[0x16]);
            auVar26[7] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x17] ==
                          local_c8[0x17]);
            auVar26[8] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x18] ==
                          local_c8[0x18]);
            auVar26[9] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x19] ==
                          local_c8[0x19]);
            auVar26[10] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                           local_c8[0x1a]);
            auVar26[0xb] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                            local_c8[0x1b]);
            auVar26[0xc] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                            local_c8[0x1c]);
            auVar26[0xd] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                            local_c8[0x1d]);
            auVar26[0xe] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                            local_c8[0x1e]);
            auVar26[0xf] = -((pTVar10->hash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                            local_c8[0x1f]);
            auVar26 = auVar26 & auVar31;
            pTVar14 = pTVar10->sub[0]._M_t.
                      super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                      super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                      super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
            if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_003d88a0;
            pTVar14->done = false;
            (pTVar10->sub[1]._M_t.super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>.
             _M_t.super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
             super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl)->done = true;
          }
          else {
LAB_003d88a0:
            if (pTVar14->done == true) {
              pTVar5 = pTVar10->sub[1]._M_t.
                       super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                       super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                       super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
              if (pTVar5->done == true) {
                pTVar14->done = false;
                pTVar5->done = false;
                goto LAB_003d888b;
              }
              __ptr = (TreeNode *)local_c8;
              local_c8._0_8_ = pTVar5;
              std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                        ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)local_e8,
                         (value_type *)local_c8);
            }
            else {
              __ptr = (TreeNode *)local_c8;
              local_c8._0_8_ = pTVar14;
              std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                        ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)local_e8,
                         (value_type *)local_c8);
            }
          }
        }
      } while ((pointer)local_e8._0_8_ != stack0xffffffffffffff20);
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl = local_128.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 8) =
           local_128.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 0x10) =
           local_128.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_128.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar21 = true;
LAB_003d896c:
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
      ._M_engaged = bVar21;
      if ((pointer)local_e8._0_8_ != (pointer)0x0) {
        __ptr = (TreeNode *)((long)local_d8 - local_e8._0_8_);
        operator_delete((void *)local_e8._0_8_,(ulong)__ptr);
      }
LAB_003d8988:
      lVar16 = 0x28;
      do {
        pdVar6 = *(default_delete<TreeNode> **)((long)local_c8 + lVar16 + 0x20U);
        if (pdVar6 != (default_delete<TreeNode> *)0x0) {
          std::default_delete<TreeNode>::operator()(pdVar6,__ptr);
        }
        *(undefined8 *)((long)local_c8 + lVar16 + 0x20U) = 0;
        lVar16 = lVar16 + -8;
      } while (lVar16 != 0x18);
    }
    std::
    vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ::~vector(&local_128);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
    ._M_engaged = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::vector<std::tuple<int, std::vector<unsigned char>, int>>> InferTaprootTree(const TaprootSpendData& spenddata, const XOnlyPubKey& output)
{
    // Verify that the output matches the assumed Merkle root and internal key.
    auto tweak = spenddata.internal_key.CreateTapTweak(spenddata.merkle_root.IsNull() ? nullptr : &spenddata.merkle_root);
    if (!tweak || tweak->first != output) return std::nullopt;
    // If the Merkle root is 0, the tree is empty, and we're done.
    std::vector<std::tuple<int, std::vector<unsigned char>, int>> ret;
    if (spenddata.merkle_root.IsNull()) return ret;

    /** Data structure to represent the nodes of the tree we're going to build. */
    struct TreeNode {
        /** Hash of this node, if known; 0 otherwise. */
        uint256 hash;
        /** The left and right subtrees (note that their order is irrelevant). */
        std::unique_ptr<TreeNode> sub[2];
        /** If this is known to be a leaf node, a pointer to the (script, leaf_ver) pair.
         *  nullptr otherwise. */
        const std::pair<std::vector<unsigned char>, int>* leaf = nullptr;
        /** Whether or not this node has been explored (is known to be a leaf, or known to have children). */
        bool explored = false;
        /** Whether or not this node is an inner node (unknown until explored = true). */
        bool inner;
        /** Whether or not we have produced output for this subtree. */
        bool done = false;
    };

    // Build tree from the provided branches.
    TreeNode root;
    root.hash = spenddata.merkle_root;
    for (const auto& [key, control_blocks] : spenddata.scripts) {
        const auto& [script, leaf_ver] = key;
        for (const auto& control : control_blocks) {
            // Skip script records with nonsensical leaf version.
            if (leaf_ver < 0 || leaf_ver >= 0x100 || leaf_ver & 1) continue;
            // Skip script records with invalid control block sizes.
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE ||
                ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) continue;
            // Skip script records that don't match the control block.
            if ((control[0] & TAPROOT_LEAF_MASK) != leaf_ver) continue;
            // Skip script records that don't match the provided Merkle root.
            const uint256 leaf_hash = ComputeTapleafHash(leaf_ver, script);
            const uint256 merkle_root = ComputeTaprootMerkleRoot(control, leaf_hash);
            if (merkle_root != spenddata.merkle_root) continue;

            TreeNode* node = &root;
            size_t levels = (control.size() - TAPROOT_CONTROL_BASE_SIZE) / TAPROOT_CONTROL_NODE_SIZE;
            for (size_t depth = 0; depth < levels; ++depth) {
                // Can't descend into a node which we already know is a leaf.
                if (node->explored && !node->inner) return std::nullopt;

                // Extract partner hash from Merkle branch in control block.
                uint256 hash;
                std::copy(control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - 1 - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          hash.begin());

                if (node->sub[0]) {
                    // Descend into the existing left or right branch.
                    bool desc = false;
                    for (int i = 0; i < 2; ++i) {
                        if (node->sub[i]->hash == hash || (node->sub[i]->hash.IsNull() && node->sub[1-i]->hash != hash)) {
                            node->sub[i]->hash = hash;
                            node = &*node->sub[1-i];
                            desc = true;
                            break;
                        }
                    }
                    if (!desc) return std::nullopt; // This probably requires a hash collision to hit.
                } else {
                    // We're in an unexplored node. Create subtrees and descend.
                    node->explored = true;
                    node->inner = true;
                    node->sub[0] = std::make_unique<TreeNode>();
                    node->sub[1] = std::make_unique<TreeNode>();
                    node->sub[1]->hash = hash;
                    node = &*node->sub[0];
                }
            }
            // Cannot turn a known inner node into a leaf.
            if (node->sub[0]) return std::nullopt;
            node->explored = true;
            node->inner = false;
            node->leaf = &key;
            node->hash = leaf_hash;
        }
    }

    // Recursive processing to turn the tree into flattened output. Use an explicit stack here to avoid
    // overflowing the call stack (the tree may be 128 levels deep).
    std::vector<TreeNode*> stack{&root};
    while (!stack.empty()) {
        TreeNode& node = *stack.back();
        if (!node.explored) {
            // Unexplored node, which means the tree is incomplete.
            return std::nullopt;
        } else if (!node.inner) {
            // Leaf node; produce output.
            ret.emplace_back(stack.size() - 1, node.leaf->first, node.leaf->second);
            node.done = true;
            stack.pop_back();
        } else if (node.sub[0]->done && !node.sub[1]->done && !node.sub[1]->explored && !node.sub[1]->hash.IsNull() &&
                   ComputeTapbranchHash(node.sub[1]->hash, node.sub[1]->hash) == node.hash) {
            // Whenever there are nodes with two identical subtrees under it, we run into a problem:
            // the control blocks for the leaves underneath those will be identical as well, and thus
            // they will all be matched to the same path in the tree. The result is that at the location
            // where the duplicate occurred, the left child will contain a normal tree that can be explored
            // and processed, but the right one will remain unexplored.
            //
            // This situation can be detected, by encountering an inner node with unexplored right subtree
            // with known hash, and H_TapBranch(hash, hash) is equal to the parent node (this node)'s hash.
            //
            // To deal with this, simply process the left tree a second time (set its done flag to false;
            // noting that the done flag of its children have already been set to false after processing
            // those). To avoid ending up in an infinite loop, set the done flag of the right (unexplored)
            // subtree to true.
            node.sub[0]->done = false;
            node.sub[1]->done = true;
        } else if (node.sub[0]->done && node.sub[1]->done) {
            // An internal node which we're finished with.
            node.sub[0]->done = false;
            node.sub[1]->done = false;
            node.done = true;
            stack.pop_back();
        } else if (!node.sub[0]->done) {
            // An internal node whose left branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[0]);
        } else if (!node.sub[1]->done) {
            // An internal node whose right branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[1]);
        }
    }

    return ret;
}